

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O0

service * asio::detail::service_registry::
          create<asio::detail::resolver_service<asio::ip::udp>,asio::io_context>(void *owner)

{
  service *psVar1;
  execution_context *in_stack_ffffffffffffffe8;
  resolver_service<asio::ip::udp> *in_stack_fffffffffffffff0;
  
  psVar1 = (service *)operator_new(0x68);
  resolver_service<asio::ip::udp>::resolver_service
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return psVar1;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}